

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NonMaximumSuppression::MergeFrom
          (NonMaximumSuppression *this,NonMaximumSuppression *from)

{
  double dVar1;
  void *pvVar2;
  ArenaStringPtr AVar3;
  LogMessage *other;
  NonMaximumSuppression_PickTop *this_00;
  NonMaximumSuppression_PickTop *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NonMaximumSuppression.pb.cc"
               ,0x353);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  AVar3.ptr_ = (from->confidenceinputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceinputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  AVar3.ptr_ = (from->coordinatesinputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesinputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  AVar3.ptr_ = (from->iouthresholdinputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->iouthresholdinputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  AVar3.ptr_ = (from->confidencethresholdinputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidencethresholdinputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  AVar3.ptr_ = (from->confidenceoutputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->confidenceoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  AVar3.ptr_ = (from->coordinatesoutputfeaturename_).ptr_;
  if ((AVar3.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->coordinatesoutputfeaturename_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar3);
  }
  dVar1 = from->iouthreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->iouthreshold_ = dVar1;
  }
  dVar1 = from->confidencethreshold_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->confidencethreshold_ = dVar1;
  }
  if (from->_oneof_case_[0] == 1) {
    this_00 = mutable_picktop(this);
    from_00 = picktop(from);
    NonMaximumSuppression_PickTop::MergeFrom(this_00,from_00);
  }
  if (from->_oneof_case_[1] == 0x65) {
    this_02 = mutable_int64classlabels(this);
    from_02 = int64classlabels(from);
    Int64Vector::MergeFrom(this_02,from_02);
  }
  else if (from->_oneof_case_[1] == 100) {
    this_01 = mutable_stringclasslabels(this);
    from_01 = stringclasslabels(from);
    StringVector::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

void NonMaximumSuppression::MergeFrom(const NonMaximumSuppression& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NonMaximumSuppression)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.confidenceinputfeaturename().size() > 0) {

    confidenceinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceinputfeaturename_);
  }
  if (from.coordinatesinputfeaturename().size() > 0) {

    coordinatesinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesinputfeaturename_);
  }
  if (from.iouthresholdinputfeaturename().size() > 0) {

    iouthresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.iouthresholdinputfeaturename_);
  }
  if (from.confidencethresholdinputfeaturename().size() > 0) {

    confidencethresholdinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidencethresholdinputfeaturename_);
  }
  if (from.confidenceoutputfeaturename().size() > 0) {

    confidenceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.confidenceoutputfeaturename_);
  }
  if (from.coordinatesoutputfeaturename().size() > 0) {

    coordinatesoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.coordinatesoutputfeaturename_);
  }
  if (from.iouthreshold() != 0) {
    set_iouthreshold(from.iouthreshold());
  }
  if (from.confidencethreshold() != 0) {
    set_confidencethreshold(from.confidencethreshold());
  }
  switch (from.SuppressionMethod_case()) {
    case kPickTop: {
      mutable_picktop()->::CoreML::Specification::NonMaximumSuppression_PickTop::MergeFrom(from.picktop());
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}